

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void upsertDelete(sqlite3 *db,Upsert *p)

{
  Upsert *pUVar1;
  
  do {
    pUVar1 = p->pNextUpsert;
    sqlite3ExprListDelete(db,p->pUpsertTarget);
    sqlite3ExprDelete(db,p->pUpsertTargetWhere);
    sqlite3ExprListDelete(db,p->pUpsertSet);
    sqlite3ExprDelete(db,p->pUpsertWhere);
    sqlite3DbFree(db,p->pToFree);
    sqlite3DbFreeNN(db,p);
    p = pUVar1;
  } while (pUVar1 != (Upsert *)0x0);
  return;
}

Assistant:

static void SQLITE_NOINLINE upsertDelete(sqlite3 *db, Upsert *p){
  do{
    Upsert *pNext = p->pNextUpsert;
    sqlite3ExprListDelete(db, p->pUpsertTarget);
    sqlite3ExprDelete(db, p->pUpsertTargetWhere);
    sqlite3ExprListDelete(db, p->pUpsertSet);
    sqlite3ExprDelete(db, p->pUpsertWhere);
    sqlite3DbFree(db, p->pToFree);
    sqlite3DbFree(db, p);
    p = pNext;
  }while( p );
}